

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa_asn1.cc
# Opt level: O3

DSA * DSA_parse_parameters(CBS *cbs)

{
  int iVar1;
  DSA *r;
  CBS child;
  CBS local_20;
  
  r = DSA_new();
  if (r != (DSA *)0x0) {
    iVar1 = CBS_get_asn1(cbs,&local_20,0x20000010);
    if ((((iVar1 == 0) || (iVar1 = parse_integer(&local_20,(BIGNUM **)r), iVar1 == 0)) ||
        (iVar1 = parse_integer(&local_20,(BIGNUM **)&r->version), iVar1 == 0)) ||
       ((iVar1 = parse_integer(&local_20,(BIGNUM **)&r->write_params), iVar1 == 0 ||
        (local_20.len != 0)))) {
      ERR_put_error(10,0,0x69,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dsa/dsa_asn1.cc"
                    ,0xb8);
    }
    else {
      iVar1 = dsa_check_key((DSA *)r);
      if (iVar1 != 0) {
        return (DSA *)r;
      }
    }
    DSA_free(r);
  }
  return (DSA *)0x0;
}

Assistant:

DSA *DSA_parse_parameters(CBS *cbs) {
  bssl::UniquePtr<DSA> ret(DSA_new());
  if (ret == nullptr) {
    return nullptr;
  }
  CBS child;
  if (!CBS_get_asn1(cbs, &child, CBS_ASN1_SEQUENCE) ||
      !parse_integer(&child, &ret->p) ||
      !parse_integer(&child, &ret->q) ||
      !parse_integer(&child, &ret->g) ||
      CBS_len(&child) != 0) {
    OPENSSL_PUT_ERROR(DSA, DSA_R_DECODE_ERROR);
    return nullptr;
  }
  if (!dsa_check_key(ret.get())) {
    return nullptr;
  }
  return ret.release();
}